

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::WriteDependencies
          (cmDependsFortran *this,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sources,string *obj,ostream *param_3,ostream *param_4)

{
  int iVar1;
  cmFortranSourceInfo *info;
  _Base_ptr p_Var2;
  char *m1;
  bool bVar3;
  cmFortranParser parser;
  cmFortranParser_s local_158;
  
  m1 = "Cannot scan dependencies without a source file.";
  if (((sources->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     (p_Var2 = (sources->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
     p_Var2[1]._M_parent != (_Base_ptr)0x0)) {
    if (obj->_M_string_length != 0) {
      bVar3 = true;
      for (; (_Rb_tree_header *)p_Var2 != &(sources->_M_t)._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        info = cmDependsFortranInternals::CreateObjectInfo
                         (this->Internal,(obj->_M_dataplus)._M_p,*(char **)(p_Var2 + 1));
        cmFortranParser_s::cmFortranParser_s
                  (&local_158,&(this->super_cmDepends).IncludePath,&this->PPDefinitions,info);
        cmFortranParser_FilePush(&local_158,*(char **)(p_Var2 + 1));
        iVar1 = cmFortran_yyparse(local_158.Scanner);
        bVar3 = (bool)(bVar3 & iVar1 == 0);
        cmFortranParser_s::~cmFortranParser_s(&local_158);
      }
      return bVar3;
    }
    m1 = "Cannot scan dependencies without an object file.";
  }
  cmSystemTools::Error(m1,(char *)0x0,(char *)0x0,(char *)0x0);
  return false;
}

Assistant:

bool cmDependsFortran::WriteDependencies(
    const std::set<std::string>& sources, const std::string& obj,
    std::ostream&, std::ostream&)
{
  // Make sure this is a scanning instance.
  if(sources.empty() || sources.begin()->empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without a source file.");
    return false;
    }
  if(obj.empty())
    {
    cmSystemTools::Error("Cannot scan dependencies without an object file.");
    return false;
    }

  bool okay = true;
  for(std::set<std::string>::const_iterator it = sources.begin();
      it != sources.end(); ++it)
    {
    const std::string& src = *it;
    // Get the information object for this source.
    cmFortranSourceInfo& info =
      this->Internal->CreateObjectInfo(obj.c_str(), src.c_str());

    // Create the parser object. The constructor takes info by reference,
    // so we may look into the resulting objects later.
    cmFortranParser parser(this->IncludePath, this->PPDefinitions, info);

    // Push on the starting file.
    cmFortranParser_FilePush(&parser, src.c_str());

    // Parse the translation unit.
    if(cmFortran_yyparse(parser.Scanner) != 0)
      {
      // Failed to parse the file.  Report failure to write dependencies.
      okay = false;
      }
    }
  return okay;
}